

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hpp
# Opt level: O2

longlong game::CountBFS<uttt::IBoard>(int depth)

{
  pointer pIVar1;
  pointer plVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  longlong lVar6;
  pointer pIVar7;
  int iVar8;
  pointer plVar9;
  long lVar10;
  initializer_list<uttt::IBoard> __l;
  vector<long,_std::allocator<long>_> moves;
  long m;
  IBoard ng;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> levels [2];
  
  uttt::IBoard::IBoard((IBoard *)&moves);
  lVar6 = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&moves;
  std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector(levels,__l,(allocator_type *)&ng)
  ;
  levels[1].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  levels[1].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  levels[1].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (depth < 1) {
    depth = 0;
  }
  uVar4 = 0;
  for (iVar8 = 0; iVar8 != depth; iVar8 = iVar8 + 1) {
    uVar5 = (ulong)(1 - (int)uVar4);
    pIVar7 = *(pointer *)(levels + uVar5);
    if (levels[uVar5].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
        super__Vector_impl_data._M_finish != pIVar7) {
      levels[uVar5].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
      super__Vector_impl_data._M_finish = pIVar7;
    }
    pIVar1 = levels[uVar4].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pIVar7 = levels[uVar4].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>.
                  _M_impl.super__Vector_impl_data._M_start; pIVar7 != pIVar1; pIVar7 = pIVar7 + 1) {
      iVar3 = uttt::IBoard::GetStatus(pIVar7);
      if (iVar3 == -1) {
        uttt::IBoard::GetPossibleMoves(&moves,pIVar7);
        plVar2 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (plVar9 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start; plVar9 != plVar2; plVar9 = plVar9 + 1) {
          m = *plVar9;
          ng._16_8_ = *(undefined8 *)((pIVar7->micro)._M_elems + 6);
          ng.macro = pIVar7->macro;
          ng.micro._M_elems[0] = (pIVar7->micro)._M_elems[0];
          ng.micro._M_elems[1] = (pIVar7->micro)._M_elems[1];
          ng.micro._M_elems._4_8_ = *(undefined8 *)((pIVar7->micro)._M_elems + 2);
          uttt::IBoard::ApplyMove(&ng,&m);
          std::vector<uttt::IBoard,std::allocator<uttt::IBoard>>::emplace_back<uttt::IBoard&>
                    ((vector<uttt::IBoard,std::allocator<uttt::IBoard>> *)(levels + uVar5),&ng);
          lVar6 = lVar6 + 1;
        }
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  (&moves.super__Vector_base<long,_std::allocator<long>_>);
      }
    }
    uVar4 = uVar5;
  }
  lVar10 = 0x18;
  do {
    std::_Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>::~_Vector_base
              ((_Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)
               ((long)&levels[0].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  return lVar6;
}

Assistant:

long long
CountBFS(int depth)
{
    long long total = 1;
    std::vector<IGame> levels[2] = {{{}}};
    int current_level = 0;
    for (int i = 0; i < depth; ++i)
    {
        levels[1 - current_level].clear();
        for (const auto &g : levels[current_level])
        {
            if (g.GetStatus() != Undecided)
                continue;
            auto moves = g.GetPossibleMoves();
            for (auto m : moves)
            {
                auto ng = g;
                ng.ApplyMove(m);
                levels[1 - current_level].emplace_back(ng);
                ++total;
            }
        }
        current_level = 1 - current_level;
    }
    return total;
}